

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall
QItemSelectionModelPrivate::rowsAboutToBeRemoved
          (QItemSelectionModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QAbstractItemModel *pQVar1;
  Data *pDVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  parameter_type pQVar8;
  iterator o;
  QItemSelectionRange *pQVar9;
  arrow_operator_result ppQVar10;
  uint in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  QItemSelectionModelPrivate *in_RDI;
  long in_FS_OFFSET;
  bool indexesOfSelectionChanged;
  QItemSelectionModel *q;
  QItemSelectionRange removedRange;
  QModelIndex itParent;
  iterator it;
  QItemSelection newParts;
  QItemSelection deselected;
  QModelIndex old;
  QModelIndex *in_stack_fffffffffffff8d8;
  QItemSelectionModelPrivate *in_stack_fffffffffffff8e0;
  QList<QItemSelectionRange> *in_stack_fffffffffffff8e8;
  QModelIndex *in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f8;
  uint in_stack_fffffffffffff8fc;
  QItemSelectionRange *in_stack_fffffffffffff900;
  iterator in_stack_fffffffffffff908;
  QItemSelection *in_stack_fffffffffffff9d8;
  QItemSelectionRange *in_stack_fffffffffffff9e0;
  QItemSelectionRange *in_stack_fffffffffffff9e8;
  bool local_481;
  const_iterator local_388;
  QItemSelectionRange *local_380;
  undefined1 local_378 [24];
  undefined1 local_360 [24];
  undefined1 local_348 [24];
  undefined1 local_330 [24];
  undefined1 *local_318;
  undefined1 *puStack_310;
  undefined1 local_308 [24];
  undefined1 local_2f0 [88];
  undefined1 local_298 [24];
  undefined1 local_280 [64];
  undefined1 local_240 [24];
  undefined1 local_228 [40];
  undefined1 local_200 [24];
  undefined1 local_1e8 [64];
  QItemSelectionRange *local_1a8;
  const_iterator local_1a0;
  QItemSelectionRange *local_198;
  QItemSelectionRange *local_190;
  const_iterator local_188;
  QItemSelectionRange *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  QAbstractItemModel *local_168;
  undefined1 *local_148;
  undefined1 *puStack_140;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_138;
  iterator local_110;
  undefined1 *local_108;
  undefined1 *puStack_100;
  undefined1 *local_f8;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 local_68 [24];
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  finalize(in_stack_fffffffffffff8e0);
  bVar4 = QPersistentModelIndex::isValid((QPersistentModelIndex *)in_stack_fffffffffffff8e0);
  bVar3 = false;
  if (bVar4) {
    QPersistentModelIndex::parent((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
    bVar4 = ::operator==((QModelIndex *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    bVar3 = false;
    if (bVar4) {
      iVar6 = QPersistentModelIndex::row((QPersistentModelIndex *)in_stack_fffffffffffff8d8);
      bVar3 = false;
      if ((int)in_EDX <= iVar6) {
        iVar6 = QPersistentModelIndex::row((QPersistentModelIndex *)in_stack_fffffffffffff8d8);
        bVar3 = iVar6 <= (int)in_ECX;
      }
    }
  }
  if (!bVar3) goto LAB_0082700d;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
  if ((int)in_EDX < 1) {
    pQVar8 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             ::value((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                      *)in_stack_fffffffffffff8e0);
    if (pQVar8 != (parameter_type)0x0) {
      ppQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                 ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                               *)in_stack_fffffffffffff8e0);
      iVar6 = (*((*ppQVar10)->super_QObject)._vptr_QObject[0xf])(*ppQVar10,in_RSI);
      if ((int)in_ECX < iVar6 + -1) {
        ppQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                   ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                 *)in_stack_fffffffffffff8e0);
        pQVar1 = *ppQVar10;
        uVar7 = QModelIndex::column((QModelIndex *)&local_38);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (local_68,pQVar1,(ulong)(in_ECX + 1),(ulong)uVar7,in_RSI);
        QPersistentModelIndex::operator=
                  ((QPersistentModelIndex *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
        goto LAB_00826efb;
      }
    }
    QModelIndex::QModelIndex((QModelIndex *)0x826edd);
    QPersistentModelIndex::operator=
              ((QPersistentModelIndex *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  }
  else {
    ppQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
               ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                             *)in_stack_fffffffffffff8e0);
    pQVar1 = *ppQVar10;
    uVar7 = QModelIndex::column((QModelIndex *)&local_38);
    (*(pQVar1->super_QObject)._vptr_QObject[0xc])
              (local_50,pQVar1,(ulong)(in_EDX - 1),(ulong)uVar7,in_RSI);
    QPersistentModelIndex::operator=
              ((QPersistentModelIndex *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  }
LAB_00826efb:
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
  QItemSelectionModel::currentChanged
            ((QItemSelectionModel *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
             (QModelIndex *)0x826f44);
  QPersistentModelIndex::operator_cast_to_QModelIndex
            ((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
  QItemSelectionModel::currentRowChanged
            ((QItemSelectionModel *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
             (QModelIndex *)0x826f8d);
  iVar6 = QPersistentModelIndex::column((QPersistentModelIndex *)in_stack_fffffffffffff8d8);
  iVar5 = QModelIndex::column((QModelIndex *)&local_38);
  if (iVar6 != iVar5) {
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
    QItemSelectionModel::currentColumnChanged
              ((QItemSelectionModel *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
               (QModelIndex *)0x82700b);
  }
LAB_0082700d:
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)0x827043);
  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection((QItemSelection *)0x82706f);
  bVar3 = false;
  local_110.i = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_110 = QList<QItemSelectionRange>::begin
                        ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8e0);
LAB_008270b2:
  do {
    while( true ) {
      o = QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)in_stack_fffffffffffff8e0);
      bVar4 = QList<QItemSelectionRange>::iterator::operator!=(&local_110,o);
      if (!bVar4) {
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8
                  );
        bVar4 = QList<QItemSelectionRange>::isEmpty((QList<QItemSelectionRange> *)0x8280f3);
        if ((!bVar4) || (bVar3)) {
          QItemSelection::QItemSelection((QItemSelection *)0x82813d);
          QItemSelectionModel::selectionChanged
                    ((QItemSelectionModel *)in_stack_fffffffffffff8e0,
                     (QItemSelection *)in_stack_fffffffffffff8d8,(QItemSelection *)0x828154);
          QItemSelection::~QItemSelection((QItemSelection *)0x828163);
        }
        QItemSelection::~QItemSelection((QItemSelection *)0x828199);
        QItemSelection::~QItemSelection((QItemSelection *)0x8281a6);
        if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
          __stack_chk_fail();
        }
        return;
      }
      pQVar9 = QList<QItemSelectionRange>::iterator::operator->(&local_110);
      QItemSelectionRange::topLeft(pQVar9);
      QPersistentModelIndex::parent((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
      bVar4 = ::operator!=((QModelIndex *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      if (!bVar4) break;
      local_148 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
      local_138.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar9 = QList<QItemSelectionRange>::iterator::operator->(&local_110);
      QItemSelectionRange::topLeft(pQVar9);
      QPersistentModelIndex::parent((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
      while( true ) {
        bVar4 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffff8e0);
        local_481 = false;
        if (bVar4) {
          QModelIndex::parent(in_stack_fffffffffffff8f0);
          local_481 = ::operator!=((QModelIndex *)in_stack_fffffffffffff8e0,
                                   in_stack_fffffffffffff8d8);
        }
        if (local_481 == false) break;
        QModelIndex::parent(in_stack_fffffffffffff8f0);
        local_148 = local_178;
        puStack_140 = local_170;
        local_138.ptr = local_168;
      }
      bVar4 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffff8e0);
      if (((bVar4) && (iVar6 = QModelIndex::row((QModelIndex *)&local_148), (int)in_EDX <= iVar6))
         && (iVar6 = QModelIndex::row((QModelIndex *)&local_148), iVar6 <= (int)in_ECX)) {
        QList<QItemSelectionRange>::iterator::operator*(&local_110);
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8e0,
                   (parameter_type)in_stack_fffffffffffff8d8);
        local_190 = local_110.i;
        QList<QItemSelectionRange>::const_iterator::const_iterator(&local_188,local_110);
        local_180 = (QItemSelectionRange *)
                    QList<QItemSelectionRange>::erase
                              ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8f0,
                               in_stack_fffffffffffff908.i);
        local_110 = (iterator)local_180;
      }
      else {
        bVar4 = QModelIndex::isValid((QModelIndex *)in_stack_fffffffffffff8e0);
        if ((bVar4) && (iVar6 = QModelIndex::row((QModelIndex *)&local_148), (int)in_ECX < iVar6)) {
          bVar3 = true;
        }
        QList<QItemSelectionRange>::iterator::operator++(&local_110);
      }
    }
    QList<QItemSelectionRange>::iterator::operator->(&local_110);
    iVar6 = QItemSelectionRange::bottom((QItemSelectionRange *)0x82742f);
    if ((int)in_EDX <= iVar6) {
      QList<QItemSelectionRange>::iterator::operator->(&local_110);
      iVar6 = QItemSelectionRange::bottom((QItemSelectionRange *)0x827472);
      if (iVar6 <= (int)in_ECX) {
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        iVar6 = QItemSelectionRange::top((QItemSelectionRange *)0x8274c1);
        if ((int)in_EDX <= iVar6) {
          QList<QItemSelectionRange>::iterator::operator->(&local_110);
          iVar6 = QItemSelectionRange::top((QItemSelectionRange *)0x827504);
          if (iVar6 <= (int)in_ECX) {
            QList<QItemSelectionRange>::iterator::operator*(&local_110);
            QList<QItemSelectionRange>::append
                      ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8e0,
                       (parameter_type)in_stack_fffffffffffff8d8);
            local_1a8 = local_110.i;
            QList<QItemSelectionRange>::const_iterator::const_iterator(&local_1a0,local_110);
            local_198 = (QItemSelectionRange *)
                        QList<QItemSelectionRange>::erase
                                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8f0,
                                   in_stack_fffffffffffff908.i);
            local_110 = (iterator)local_198;
            goto LAB_008270b2;
          }
        }
      }
    }
    QList<QItemSelectionRange>::iterator::operator->(&local_110);
    iVar6 = QItemSelectionRange::top((QItemSelectionRange *)0x827600);
    if ((int)in_EDX <= iVar6) {
      QList<QItemSelectionRange>::iterator::operator->(&local_110);
      iVar6 = QItemSelectionRange::top((QItemSelectionRange *)0x827643);
      if (iVar6 <= (int)in_ECX) {
        pQVar9 = QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::topLeft(pQVar9);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
        ppQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                   ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                 *)in_stack_fffffffffffff8e0);
        pQVar1 = *ppQVar10;
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        uVar7 = QItemSelectionRange::right((QItemSelectionRange *)0x827705);
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (local_1e8,pQVar1,(ulong)in_ECX,(ulong)uVar7,local_200);
        QItemSelectionRange::QItemSelectionRange
                  (in_stack_fffffffffffff900,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                   in_stack_fffffffffffff8f0);
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8e0,
                   (rvalue_ref)in_stack_fffffffffffff8d8);
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        ppQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                   ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                 *)in_stack_fffffffffffff8e0);
        pQVar1 = *ppQVar10;
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        uVar7 = QItemSelectionRange::left((QItemSelectionRange *)0x827812);
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (local_228,pQVar1,(ulong)(in_ECX + 1),(ulong)uVar7,local_240);
        pQVar9 = QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::bottomRight(pQVar9);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
        QItemSelectionRange::QItemSelectionRange
                  (in_stack_fffffffffffff900,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                   in_stack_fffffffffffff8f0);
        QList<QItemSelectionRange>::iterator::operator*(&local_110);
        QItemSelectionRange::operator=
                  ((QItemSelectionRange *)in_stack_fffffffffffff8e0,
                   (QItemSelectionRange *)in_stack_fffffffffffff8d8);
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        QList<QItemSelectionRange>::iterator::operator++(&local_110);
        goto LAB_008270b2;
      }
    }
    QList<QItemSelectionRange>::iterator::operator->(&local_110);
    iVar6 = QItemSelectionRange::bottom((QItemSelectionRange *)0x8279b9);
    if ((int)in_EDX <= iVar6) {
      QList<QItemSelectionRange>::iterator::operator->(&local_110);
      iVar6 = QItemSelectionRange::bottom((QItemSelectionRange *)0x8279fc);
      if (iVar6 <= (int)in_ECX) {
        ppQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                   ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                 *)in_stack_fffffffffffff8e0);
        pQVar1 = *ppQVar10;
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        uVar7 = QItemSelectionRange::left((QItemSelectionRange *)0x827a79);
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (local_280,pQVar1,(ulong)in_EDX,(ulong)uVar7,local_298);
        pQVar9 = QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::bottomRight(pQVar9);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
        QItemSelectionRange::QItemSelectionRange
                  (in_stack_fffffffffffff900,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                   in_stack_fffffffffffff8f0);
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8e0,
                   (rvalue_ref)in_stack_fffffffffffff8d8);
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        in_stack_fffffffffffff9e8 = QList<QItemSelectionRange>::iterator::operator->(&local_110);
        in_stack_fffffffffffff9e0 =
             (QItemSelectionRange *)QItemSelectionRange::topLeft(in_stack_fffffffffffff9e8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)in_stack_fffffffffffff8f0);
        in_stack_fffffffffffff9d8 =
             (QItemSelection *)
             QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                           *)in_stack_fffffffffffff8e0);
        pDVar2 = (in_stack_fffffffffffff9d8->super_QList<QItemSelectionRange>).d.d;
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        uVar7 = QItemSelectionRange::right((QItemSelectionRange *)0x827c10);
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        (*(*(_func_int ***)&(pDVar2->super_QArrayData).ref_)[0xc])
                  (local_2f0,pDVar2,(ulong)(in_EDX - 1),(ulong)uVar7,local_308);
        QItemSelectionRange::QItemSelectionRange
                  (in_stack_fffffffffffff900,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                   in_stack_fffffffffffff8f0);
        QList<QItemSelectionRange>::iterator::operator*(&local_110);
        QItemSelectionRange::operator=
                  ((QItemSelectionRange *)in_stack_fffffffffffff8e0,
                   (QItemSelectionRange *)in_stack_fffffffffffff8d8);
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        QList<QItemSelectionRange>::iterator::operator++(&local_110);
        goto LAB_008270b2;
      }
    }
    QList<QItemSelectionRange>::iterator::operator->(&local_110);
    iVar6 = QItemSelectionRange::top((QItemSelectionRange *)0x827d64);
    if (iVar6 < (int)in_EDX) {
      QList<QItemSelectionRange>::iterator::operator->(&local_110);
      iVar6 = QItemSelectionRange::bottom((QItemSelectionRange *)0x827db3);
      if ((int)in_ECX < iVar6) {
        local_318 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_310 = &DAT_aaaaaaaaaaaaaaaa;
        ppQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                   ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                 *)in_stack_fffffffffffff8e0);
        pQVar1 = *ppQVar10;
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        uVar7 = QItemSelectionRange::left((QItemSelectionRange *)0x827e41);
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (local_330,pQVar1,(ulong)in_EDX,(ulong)uVar7,local_348);
        ppQVar10 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                   ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                 *)in_stack_fffffffffffff8e0);
        pQVar1 = *ppQVar10;
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        uVar7 = QItemSelectionRange::right((QItemSelectionRange *)0x827ef1);
        QList<QItemSelectionRange>::iterator::operator->(&local_110);
        QItemSelectionRange::parent((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (local_360,pQVar1,(ulong)in_ECX,(ulong)uVar7,local_378);
        QItemSelectionRange::QItemSelectionRange
                  (in_stack_fffffffffffff900,
                   (QModelIndex *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
                   in_stack_fffffffffffff8f0);
        QList<QItemSelectionRange>::append
                  ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8e0,
                   (parameter_type)in_stack_fffffffffffff8d8);
        QList<QItemSelectionRange>::iterator::operator*(&local_110);
        QItemSelection::split
                  (in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        QList<QItemSelectionRange>::const_iterator::const_iterator(&local_388,local_110);
        in_stack_fffffffffffff908 =
             QList<QItemSelectionRange>::erase
                       ((QList<QItemSelectionRange> *)in_stack_fffffffffffff8f0,
                        in_stack_fffffffffffff908.i);
        local_380 = in_stack_fffffffffffff908.i;
        local_110 = in_stack_fffffffffffff908;
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)in_stack_fffffffffffff8e0);
        goto LAB_008270b2;
      }
    }
    in_stack_fffffffffffff8fc = in_ECX;
    in_stack_fffffffffffff900 = QList<QItemSelectionRange>::iterator::operator->(&local_110);
    in_stack_fffffffffffff8f8 = QItemSelectionRange::top((QItemSelectionRange *)0x828080);
    if ((int)in_stack_fffffffffffff8fc < in_stack_fffffffffffff8f8) {
      bVar3 = true;
      QList<QItemSelectionRange>::iterator::operator++(&local_110);
    }
    else {
      QList<QItemSelectionRange>::iterator::operator++(&local_110);
    }
  } while( true );
}

Assistant:

void QItemSelectionModelPrivate::rowsAboutToBeRemoved(const QModelIndex &parent,
                                                         int start, int end)
{
    Q_Q(QItemSelectionModel);
    Q_ASSERT(start <= end);
    finalize();

    // update current index
    if (currentIndex.isValid() && parent == currentIndex.parent()
        && currentIndex.row() >= start && currentIndex.row() <= end) {
        QModelIndex old = currentIndex;
        if (start > 0) {
            // there are rows left above the change
            currentIndex = model->index(start - 1, old.column(), parent);
        } else if (model.value() && end < model->rowCount(parent) - 1) {
            // there are rows left below the change
            currentIndex = model->index(end + 1, old.column(), parent);
        } else {
            // there are no rows left in the table
            currentIndex = QModelIndex();
        }
        emit q->currentChanged(currentIndex, old);
        emit q->currentRowChanged(currentIndex, old);
        if (currentIndex.column() != old.column())
            emit q->currentColumnChanged(currentIndex, old);
    }

    QItemSelection deselected;
    QItemSelection newParts;
    bool indexesOfSelectionChanged = false;
    QItemSelection::iterator it = ranges.begin();
    while (it != ranges.end()) {
        if (it->topLeft().parent() != parent) {  // Check parents until reaching root or contained in range
            QModelIndex itParent = it->topLeft().parent();
            while (itParent.isValid() && itParent.parent() != parent)
                itParent = itParent.parent();

            if (itParent.isValid() && start <= itParent.row() && itParent.row() <= end) {
                deselected.append(*it);
                it = ranges.erase(it);
            } else {
                if (itParent.isValid() && end < itParent.row())
                    indexesOfSelectionChanged = true;
                ++it;
            }
        } else if (start <= it->bottom() && it->bottom() <= end    // Full inclusion
                   && start <= it->top() && it->top() <= end) {
            deselected.append(*it);
            it = ranges.erase(it);
        } else if (start <= it->top() && it->top() <= end) {      // Top intersection
            deselected.append(QItemSelectionRange(it->topLeft(), model->index(end, it->right(), it->parent())));
            *it = QItemSelectionRange(model->index(end + 1, it->left(), it->parent()), it->bottomRight());
            ++it;
        } else if (start <= it->bottom() && it->bottom() <= end) {    // Bottom intersection
            deselected.append(QItemSelectionRange(model->index(start, it->left(), it->parent()), it->bottomRight()));
            *it = QItemSelectionRange(it->topLeft(), model->index(start - 1, it->right(), it->parent()));
            ++it;
        } else if (it->top() < start && end < it->bottom()) { // Middle intersection
            // If the parent contains (1, 2, 3, 4, 5, 6, 7, 8) and [3, 4, 5, 6] is selected,
            // and [4, 5] is removed, we need to split [3, 4, 5, 6] into [3], [4, 5] and [6].
            // [4, 5] is appended to deselected, and [3] and [6] remain part of the selection
            // in ranges.
            const QItemSelectionRange removedRange(model->index(start, it->left(), it->parent()),
                                                    model->index(end, it->right(), it->parent()));
            deselected.append(removedRange);
            QItemSelection::split(*it, removedRange, &newParts);
            it = ranges.erase(it);
        } else if (end < it->top()) { // deleted row before selection
            indexesOfSelectionChanged = true;
            ++it;
        } else {
            ++it;
        }
    }
    ranges.append(newParts);

    if (!deselected.isEmpty() || indexesOfSelectionChanged)
        emit q->selectionChanged(QItemSelection(), deselected);
}